

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.t.cpp
# Opt level: O1

exception_ptr anon_unknown.dwarf_32d26::make_ep(void)

{
  undefined8 uVar1;
  long *in_RDI;
  undefined1 local_28 [16];
  
  local_28[0] = 0;
  uVar1 = std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",1,0);
  __cxa_begin_catch(uVar1);
  std::current_exception();
  *in_RDI = (long)local_28;
  __cxa_end_catch();
  return (exception_ptr)in_RDI;
}

Assistant:

std::exception_ptr make_ep()
{
    try
    {
        // this generates an std::out_of_range:
        (void) std::string().at(1);
    }
    catch(...)
    {
        return std::current_exception();
    }
    return nullptr;
}